

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O3

void __thiscall duckdb::Bit::ToBit(Bit *this,string_t str,bitstring_t *output_str)

{
  char *pcVar1;
  bitstring_t *str_00;
  char *pcVar2;
  ulong uVar3;
  byte bVar4;
  idx_t bit_idx;
  long lVar5;
  ulong uVar6;
  string_t str_local;
  
  str_00 = str.value._8_8_;
  str_local.value.pointer.ptr = str.value._0_8_;
  pcVar2 = str.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar2 = str_local.value.pointer.prefix;
  }
  if ((str_00->value).pointer.length < 0xd) {
    pcVar1 = (str_00->value).pointer.prefix;
  }
  else {
    pcVar1 = (str_00->value).pointer.ptr;
  }
  uVar3 = (ulong)this & 7;
  if (uVar3 == 0) {
    bVar4 = 0;
  }
  else {
    uVar6 = 0;
    bVar4 = 0;
    do {
      bVar4 = pcVar2[uVar6] == '1' | bVar4 * '\x02';
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
    *pcVar1 = '\b' - (char)uVar3;
    pcVar1 = pcVar1 + 1;
  }
  *pcVar1 = bVar4;
  if (7 < (uint)this) {
    pcVar2 = pcVar2 + uVar3;
    do {
      lVar5 = 0;
      bVar4 = 0;
      do {
        bVar4 = pcVar2[lVar5] == '1' | bVar4 * '\x02';
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      pcVar1[1] = bVar4;
      pcVar1 = pcVar1 + 1;
      uVar3 = uVar3 + 8;
      pcVar2 = pcVar2 + 8;
    } while (uVar3 < ((ulong)this & 0xffffffff));
  }
  str_local.value._0_8_ = this;
  Finalize(str_00);
  return;
}

Assistant:

const char *GetData() const {
		return IsInlined() ? const_char_ptr_cast(value.inlined.inlined) : value.pointer.ptr;
	}